

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Boundary_matrix.h
# Opt level: O3

void __thiscall
Gudhi::persistence_matrix::
Boundary_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,(Gudhi::persistence_matrix::Column_types)7,false,true,true,false>>>
::_container_insert<std::initializer_list<std::pair<unsigned_int,unsigned_int>>>
          (Boundary_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,(Gudhi::persistence_matrix::Column_types)7,false,true,true,false>>>
           *this,initializer_list<std::pair<unsigned_int,_unsigned_int>_> *column,Index pos,
          Dimension dim)

{
  Delete_disposer disposer;
  size_type sVar1;
  iterator ppVar2;
  node_ptr plVar3;
  node_ptr *pplVar4;
  node_ptr to_erase;
  pointer pEVar5;
  uint uVar6;
  long lVar7;
  node_ptr plVar8;
  ulong uVar9;
  ulong uVar10;
  list_impl<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,(Gudhi::persistence_matrix::Column_types)7,false,true,true,false>>>,boost::intrusive::list_node_traits<void*>,(boost::intrusive::link_mode_type)1,Gudhi::persistence_matrix::Matrix<RU_rep_options<false,(Gudhi::persistence_matrix::Column_types)7,false,true,true,false>>::Matrix_column_tag,1u>,unsigned_long,false,void>
  *this_00;
  uint local_78;
  uint local_74;
  Dimension local_70;
  Field_operators *local_68;
  New_cloner local_60;
  list_node<void_*> local_58;
  ulong local_48;
  vector<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,(Gudhi::persistence_matrix::Column_types)7,false,true,true,false>>>,std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,(Gudhi::persistence_matrix::Column_types)7,false,true,true,false>>>>>
  *local_40;
  Matrix_all_dimension_holder<int> *local_38;
  
  lVar7 = *(long *)(this + 0x20);
  uVar9 = (*(long *)(this + 0x28) - lVar7 >> 3) * -0x3333333333333333;
  uVar10 = (ulong)pos;
  local_78 = dim;
  if (uVar9 < uVar10 || uVar9 - uVar10 == 0) {
    std::
    vector<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,(Gudhi::persistence_matrix::Column_types)7,false,true,true,false>>>,std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,(Gudhi::persistence_matrix::Column_types)7,false,true,true,false>>>>>
    ::
    emplace_back<std::initializer_list<std::pair<unsigned_int,unsigned_int>>const&,int&,Gudhi::persistence_matrix::Matrix<RU_rep_options<false,(Gudhi::persistence_matrix::Column_types)7,false,true,true,false>>::Column_zp_settings*&>
              ((vector<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,(Gudhi::persistence_matrix::Column_types)7,false,true,true,false>>>,std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,(Gudhi::persistence_matrix::Column_types)7,false,true,true,false>>>>>
                *)(this + 0x20),column,(int *)&local_78,(Column_zp_settings **)(this + 0x40));
  }
  else {
    local_68 = *(Field_operators **)(this + 0x40);
    sVar1 = column->_M_len;
    local_60.entryPool_ = (Entry_constructor *)(local_68 + 1);
    local_70 = dim;
    local_58.next_ = &local_58;
    local_58.prev_ = &local_58;
    if (sVar1 != 0) {
      ppVar2 = column->_M_array;
      lVar7 = 0;
      local_48 = uVar10;
      local_40 = (vector<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,(Gudhi::persistence_matrix::Column_types)7,false,true,true,false>>>,std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,(Gudhi::persistence_matrix::Column_types)7,false,true,true,false>>>>>
                  *)(this + 0x20);
      local_38 = (Matrix_all_dimension_holder<int> *)this;
      do {
        uVar6 = *(uint *)((long)&ppVar2->second + lVar7);
        if (local_68->characteristic_ <= uVar6) {
          uVar6 = uVar6 % local_68->characteristic_;
        }
        local_74 = *(uint *)((long)&ppVar2->first + lVar7);
        pEVar5 = Simple_object_pool<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,(Gudhi::persistence_matrix::Column_types)7,false,true,true,false>>>>
                 ::construct<unsigned_int&>
                           ((Simple_object_pool<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,(Gudhi::persistence_matrix::Column_types)7,false,true,true,false>>>>
                             *)local_60.entryPool_,&local_74);
        (pEVar5->super_Entry_field_element_option).element_ = uVar6;
        if ((pEVar5->super_Column_hook).super_type.super_type.super_list_node<void_*>.next_ !=
            (node_ptr)0x0) {
          __assert_fail("!safemode_or_autounlink || node_algorithms::inited(to_insert)",
                        "/usr/include/boost/intrusive/list.hpp",0x33c,
                        "iterator boost::intrusive::list_impl<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options<false, Gudhi::persistence_matrix::Column_types::INTRUSIVE_LIST, false, true, true, false>>>, boost::intrusive::list_node_traits<void *>, boost::intrusive::safe_link, Gudhi::persistence_matrix::Matrix<RU_rep_options<false, Gudhi::persistence_matrix::Column_types::INTRUSIVE_LIST, false, true, true, false>>::Matrix_column_tag, 1>, unsigned long, false, void>::insert(const_iterator, reference) [ValueTraits = boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options<false, Gudhi::persistence_matrix::Column_types::INTRUSIVE_LIST, false, true, true, false>>>, boost::intrusive::list_node_traits<void *>, boost::intrusive::safe_link, Gudhi::persistence_matrix::Matrix<RU_rep_options<false, Gudhi::persistence_matrix::Column_types::INTRUSIVE_LIST, false, true, true, false>>::Matrix_column_tag, 1>, SizeType = unsigned long, ConstantTimeSize = false, HeaderHolder = void]"
                       );
        }
        (pEVar5->super_Column_hook).super_type.super_type.super_list_node<void_*>.prev_ =
             local_58.prev_;
        (pEVar5->super_Column_hook).super_type.super_type.super_list_node<void_*>.next_ = &local_58;
        pplVar4 = &(local_58.prev_)->next_;
        local_58.prev_ = (node_ptr)&pEVar5->super_Column_hook;
        *pplVar4 = (node_ptr)&pEVar5->super_Column_hook;
        lVar7 = lVar7 + 8;
      } while (sVar1 << 3 != lVar7);
      lVar7 = *(long *)local_40;
      uVar10 = local_48;
      this = (Boundary_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,(Gudhi::persistence_matrix::Column_types)7,false,true,true,false>>>
              *)local_38;
    }
    disposer.col_ =
         (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_false>_>_>
          *)(lVar7 + uVar10 * 0x28);
    ((disposer.col_)->super_Column_dimension_option).dim_ = local_70;
    this_00 = (list_impl<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,(Gudhi::persistence_matrix::Column_types)7,false,true,true,false>>>,boost::intrusive::list_node_traits<void*>,(boost::intrusive::link_mode_type)1,Gudhi::persistence_matrix::Matrix<RU_rep_options<false,(Gudhi::persistence_matrix::Column_types)7,false,true,true,false>>::Matrix_column_tag,1u>,unsigned_long,false,void>
               *)(lVar7 + uVar10 * 0x28 + 0x18);
    boost::intrusive::
    list_impl<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,(Gudhi::persistence_matrix::Column_types)7,false,true,true,false>>>,boost::intrusive::list_node_traits<void*>,(boost::intrusive::link_mode_type)1,Gudhi::persistence_matrix::Matrix<RU_rep_options<false,(Gudhi::persistence_matrix::Column_types)7,false,true,true,false>>::Matrix_column_tag,1u>,unsigned_long,false,void>
    ::
    clear_and_dispose<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,(Gudhi::persistence_matrix::Column_types)7,false,true,true,false>>>::Delete_disposer>
              (this_00,disposer);
    (disposer.col_)->operators_ = local_68;
    (disposer.col_)->entryPool_ = local_60.entryPool_;
    boost::intrusive::
    list_impl<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,(Gudhi::persistence_matrix::Column_types)7,false,true,true,false>>>,boost::intrusive::list_node_traits<void*>,(boost::intrusive::link_mode_type)1,Gudhi::persistence_matrix::Matrix<RU_rep_options<false,(Gudhi::persistence_matrix::Column_types)7,false,true,true,false>>::Matrix_column_tag,1u>,unsigned_long,false,void>
    ::
    clone_from<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,(Gudhi::persistence_matrix::Column_types)7,false,true,true,false>>>::New_cloner,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,(Gudhi::persistence_matrix::Column_types)7,false,true,true,false>>>::Delete_disposer>
              (this_00,(list_impl<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_false>_>_>,_boost::intrusive::list_node_traits<void_*>,_(boost::intrusive::link_mode_type)1,_Gudhi::persistence_matrix::Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_false>_>::Matrix_column_tag,_1U>,_unsigned_long,_false,_void>
                        *)&local_58,local_60,disposer);
    plVar8 = local_58.next_;
    while (plVar8 != &local_58) {
      plVar3 = (((data_t *)&plVar8->next_)->root_plus_size_).m_header.super_node.next_;
      plVar8->next_ = (node_ptr)0x0;
      plVar8->prev_ = (node_ptr)0x0;
      Simple_object_pool<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_false>_>_>_>
      ::destroy(&(local_60.entryPool_)->entryPool_,(pointer)&plVar8[-1].prev_);
      plVar8 = plVar3;
    }
  }
  Matrix_all_dimension_holder<int>::update_up((Matrix_all_dimension_holder<int> *)this,local_78);
  return;
}

Assistant:

inline void Boundary_matrix<Master_matrix>::_container_insert(const Container& column,
                                                              Index pos,
                                                              Dimension dim)
{
  if constexpr (Master_matrix::Option_list::has_map_column_container) {
    if constexpr (Master_matrix::Option_list::has_row_access) {
      matrix_.try_emplace(pos, Column(pos, column, dim, RA_opt::rows_, colSettings_));
    } else {
      matrix_.try_emplace(pos, Column(column, dim, colSettings_));
    }
  } else {
    if constexpr (Master_matrix::Option_list::has_row_access) {
      matrix_.emplace_back(pos, column, dim, RA_opt::rows_, colSettings_);
    } else {
      if (matrix_.size() <= pos) {
        matrix_.emplace_back(column, dim, colSettings_);
      } else {
        matrix_[pos] = Column(column, dim, colSettings_);
      }
    }
  }
  if constexpr (activeDimOption) {
    Dim_opt::update_up(dim);
  }
}